

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearList.cpp
# Opt level: O0

bool DeleteElem(LinearList *L,int i)

{
  int local_20;
  int j;
  int i_local;
  LinearList *L_local;
  
  if (((i < 0) || (L->Last < i)) || (local_20 = i, L->Last == 0)) {
    L_local._7_1_ = false;
  }
  else {
    for (; local_20 < L->Last + -1; local_20 = local_20 + 1) {
      L->data[local_20] = L->data[local_20 + 1];
    }
    L->Last = L->Last + -1;
    L_local._7_1_ = true;
  }
  return L_local._7_1_;
}

Assistant:

bool DeleteElem(LinearList *L,int i)  //删除表中第i个结点
{
    if(i<0 || i > L->Last || L->Last==0)
        return false;  //第i个结点不存在，删除失败
    else
    {
        int j;
        for(j = i; j < L->Last-1; j++)
            L->data[j] = L->data[j+1];  //前移
        L->Last--;  //表长-1
        return true;  //删除成功
    }
}